

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowObjPS::execute(RowObjPS *this,
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *param_4,
                   DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                            *rStatus,bool isOptimal)

{
  int iVar1;
  pointer pnVar2;
  VarStatus *pVVar3;
  long lVar4;
  cpp_dec_float<200U,_int,_void> *v;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  VarStatus VVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  pointer pnVar9;
  byte bVar10;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar10 = 0;
  pcVar6 = &(s->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend;
  v = &(x->val).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x1c;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems[0xe] = 0;
  local_a8.data._M_elems[0xf] = 0;
  local_a8.data._M_elems[0x10] = 0;
  local_a8.data._M_elems[0x11] = 0;
  local_a8.data._M_elems[0x12] = 0;
  local_a8.data._M_elems[0x13] = 0;
  local_a8.data._M_elems[0x14] = 0;
  local_a8.data._M_elems[0x15] = 0;
  local_a8.data._M_elems[0x16] = 0;
  local_a8.data._M_elems[0x17] = 0;
  local_a8.data._M_elems[0x18] = 0;
  local_a8.data._M_elems[0x19] = 0;
  local_a8.data._M_elems._104_5_ = 0;
  local_a8.data._M_elems[0x1b]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  if (&local_a8 == v) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_a8,pcVar6);
    if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
      local_a8.neg = (bool)(local_a8.neg ^ 1);
    }
  }
  else {
    if (&local_a8 != pcVar6) {
      pcVar5 = pcVar6;
      pcVar8 = &local_a8;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(uint *)pcVar8 = (pcVar5->data)._M_elems[0];
        pcVar5 = (cpp_dec_float<200U,_int,_void> *)((pcVar5->data)._M_elems + 1);
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + 4);
      }
      local_a8.exp = pcVar6->exp;
      local_a8.neg = pcVar6->neg;
      local_a8.fpclass = pcVar6->fpclass;
      local_a8.prec_elem = pcVar6->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_a8,v);
  }
  iVar1 = this->m_i;
  pnVar2 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar6 = &local_a8;
  pnVar9 = pnVar2 + iVar1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
    pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar10 * -2 + 1) * 4);
    pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar10 * -2 + 1) * 4);
  }
  pnVar2[iVar1].m_backend.exp = local_a8.exp;
  pnVar2[iVar1].m_backend.neg = local_a8.neg;
  pnVar2[iVar1].m_backend.fpclass = local_a8.fpclass;
  pnVar2[iVar1].m_backend.prec_elem = local_a8.prec_elem;
  if (rStatus->data[this->m_i] != BASIC) {
    iVar1 = this->m_j;
    pVVar3 = cStatus->data;
    VVar7 = pVVar3[iVar1];
    if (VVar7 == ON_UPPER) {
      VVar7 = ON_LOWER;
    }
    else if (VVar7 == ON_LOWER) {
      VVar7 = ON_UPPER;
    }
    rStatus->data[this->m_i] = VVar7;
    pVVar3[iVar1] = ZERO;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowObjPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
                                     VectorBase<R>&,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   s[m_i] = s[m_i] - x[m_j];

   assert(rStatus[m_i] != SPxSolverBase<R>::UNDEFINED);
   assert(cStatus[m_j] != SPxSolverBase<R>::UNDEFINED);
   assert(rStatus[m_i] != SPxSolverBase<R>::BASIC || cStatus[m_j] != SPxSolverBase<R>::BASIC);

   SPxOut::debug(this, "RowObjPS: removing slack column {} ({}) for row {} ({}).\n", m_j, cStatus[m_j],
                 m_i, rStatus[m_i]);

   if(rStatus[m_i] != SPxSolverBase<R>::BASIC)
   {
      switch(cStatus[m_j])
      {
      case SPxSolverBase<R>::ON_UPPER:
         rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
         break;

      case SPxSolverBase<R>::ON_LOWER:
         rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;
         break;

      default:
         rStatus[m_i] = cStatus[m_j];
      }

      // otherwise checkBasisDim() may fail
      cStatus[m_j] = SPxSolverBase<R>::ZERO;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      assert(false);
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}